

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnTable
          (BinaryReaderIR *this,Index index,Type elem_type,Limits *elem_limits)

{
  undefined2 uVar1;
  Module *this_00;
  uint64_t uVar2;
  pointer pTVar3;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_60;
  Table *local_58;
  Table *table;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_30;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> field;
  Limits *elem_limits_local;
  Type elem_type_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>.
  super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>,_true,_true>
          )elem_limits;
  GetLocation((Location *)&table,this);
  MakeUnique<wabt::TableModuleField,wabt::Location>((wabt *)&local_30,(Location *)&table);
  pTVar3 = std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
           operator->(&local_30);
  local_58 = &pTVar3->table;
  uVar1 = *(undefined2 *)
           ((long)field._M_t.
                  super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                  .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x10);
  (pTVar3->table).elem_limits.has_max = (bool)(char)uVar1;
  (pTVar3->table).elem_limits.is_shared = (bool)(char)((ushort)uVar1 >> 8);
  uVar2 = *(uint64_t *)
           ((long)field._M_t.
                  super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                  .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 8);
  (pTVar3->table).elem_limits.initial =
       *(uint64_t *)
        field._M_t.
        super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>.
        _M_t.
        super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
        .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl;
  (pTVar3->table).elem_limits.max = uVar2;
  this_00 = this->module_;
  std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::unique_ptr
            (&local_60,&local_30);
  Module::AppendField(this_00,&local_60);
  std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::~unique_ptr
            (&local_60);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::~unique_ptr
            (&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnTable(Index index,
                               Type elem_type,
                               const Limits* elem_limits) {
  auto field = MakeUnique<TableModuleField>(GetLocation());
  Table& table = field->table;
  table.elem_limits = *elem_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}